

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

int Amap_ManCountInverters(Amap_Man_t *p)

{
  long *plVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    plVar1 = (long *)Vec_PtrEntry(p->vObjs,i);
    if (plVar1 != (long *)0x0) {
      iVar2 = iVar2 + (uint)(0 < *(int *)((long)plVar1 + (ulong)(-1 < *plVar1) * 4 + 0x2c));
    }
  }
  return iVar2;
}

Assistant:

int Amap_ManCountInverters( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i, Counter = 0;
    Amap_ManForEachObj( p, pObj, i )
        Counter += (int)(pObj->nFouts[!pObj->fPolar] > 0);
    return Counter;
}